

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O3

void __thiscall
ON_BumpFunction::Internal_EvaluateQuinticBump
          (ON_BumpFunction *this,double t,double dt,int der_count,double *value)

{
  size_t __n;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (1.0 <= ABS(t)) {
    if (-1 < der_count) {
      __n = (ulong)(uint)der_count * 8 + 8;
LAB_0055e675:
      memset(value,0,__n);
      return;
    }
  }
  else {
    dVar3 = 1.0 - t;
    dVar4 = dVar3 * dVar3 * dVar3;
    dVar5 = (t * 6.0 + 3.0) * t + 1.0;
    *value = dVar5 * dVar4;
    if (0 < der_count) {
      dVar2 = dVar3 * dVar3 * -3.0;
      dVar1 = t * 12.0 + 3.0;
      value[1] = (dVar2 * dVar5 + dVar1 * dVar4) * dt;
      if ((der_count != 1) &&
         (value[2] = ((dVar2 + dVar2) * dVar1 + dVar3 * 6.0 * dVar5 + dVar4 * 12.0) * dt * dt,
         2 < (uint)der_count)) {
        value = value + 3;
        __n = (ulong)(der_count - 2) << 3;
        goto LAB_0055e675;
      }
    }
  }
  return;
}

Assistant:

void ON_BumpFunction::Internal_EvaluateQuinticBump(double t, double dt, int der_count, double* value) const
{
  // c(t) = (1-t)^3 * (1 + 3t + 6t^2)
  //bool neg = (t<0.0);
  //t = fabs(t);
  if ( fabs(t) < 1.0)
  {
    double a2 = (1-t);
    double a1 = a2*a2;
    double a = a1*a2;
    double b = 1.0 + t*(3.0 + 6.0*t);
    value[0] = a*b;
    if (der_count>0)
    {
      a1 *= -3.0;
      double b1 = 3.0 + 12.0*t;
      value[1] = dt*(a1*b + b1*a);
      //if ( neg )
      //  value[1] = - value[1];
      if ( der_count > 1 )
      {
        value[2] = dt*dt*(6.0*a2*b + 12.0*a + 2.0*a1*b1);
        if ( der_count > 2 )
        {
          der_count-=2;
          value += 3;
          while ( der_count-- )
            *value++ = 0.0;
        }
      }
    }
  }
  else
  {
    while ( der_count-- >= 0 )
      *value++ = 0.0;
  }
}